

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O0

EffectProps * __thiscall
anon_unknown.dwarf_101d8b::ChorusStateFactory::getDefaultProps(ChorusStateFactory *this)

{
  EffectProps *in_RDI;
  EffectProps *props;
  
  memset(in_RDI,0,0x6c);
  (in_RDI->Reverb).Density = 1.4013e-45;
  (in_RDI->Reverb).Diffusion = 1.26117e-43;
  (in_RDI->Fshifter).RightDirection = 0x3f8ccccd;
  (in_RDI->Vmorpher).PhonemeACoarseTuning = 0x3dcccccd;
  (in_RDI->Vmorpher).PhonemeBCoarseTuning = 0x3e800000;
  (in_RDI->Vmorpher).Waveform = 0x3c83126f;
  return in_RDI;
}

Assistant:

EffectProps ChorusStateFactory::getDefaultProps() const noexcept
{
    EffectProps props{};
    props.Chorus.Waveform = AL_CHORUS_DEFAULT_WAVEFORM;
    props.Chorus.Phase = AL_CHORUS_DEFAULT_PHASE;
    props.Chorus.Rate = AL_CHORUS_DEFAULT_RATE;
    props.Chorus.Depth = AL_CHORUS_DEFAULT_DEPTH;
    props.Chorus.Feedback = AL_CHORUS_DEFAULT_FEEDBACK;
    props.Chorus.Delay = AL_CHORUS_DEFAULT_DELAY;
    return props;
}